

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

void __thiscall
Js::ProbeContainer::DispatchStepHandler
          (ProbeContainer *this,InterpreterHaltState *pHaltState,OpCode *pOriginalOpcode)

{
  bool bVar1;
  anon_class_8_1_8991fb9c local_40;
  anon_class_24_3_37d03d94 local_38;
  OpCode *local_20;
  OpCode *pOriginalOpcode_local;
  InterpreterHaltState *pHaltState_local;
  ProbeContainer *this_local;
  
  local_20 = pOriginalOpcode;
  pOriginalOpcode_local = (OpCode *)pHaltState;
  pHaltState_local = (InterpreterHaltState *)this;
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchStepHandler: start: this=%p, pHaltState=%p, pOriginalOpcode=0x%x\n"
                ,this,pHaltState,pOriginalOpcode);
  bVar1 = CanDispatchHalt(this,(InterpreterHaltState *)pOriginalOpcode_local);
  if (bVar1) {
    local_38.pHaltState = (InterpreterHaltState **)&pOriginalOpcode_local;
    local_38.pOriginalOpcode = &local_20;
    local_40.this = this;
    local_38.this = this;
    TryFinally<Js::ProbeContainer::DispatchStepHandler(Js::InterpreterHaltState*,Js::OpCode*)::__0,Js::ProbeContainer::DispatchStepHandler(Js::InterpreterHaltState*,Js::OpCode*)::__1>
              (&local_38,&local_40);
    Output::Trace(DebuggerPhase,L"ProbeContainer::DispatchStepHandler: end: pHaltState=%p\n",
                  pOriginalOpcode_local);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchStepHandler(InterpreterHaltState* pHaltState, OpCode* pOriginalOpcode)
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchStepHandler: start: this=%p, pHaltState=%p, pOriginalOpcode=0x%x\n"), this, pHaltState, pOriginalOpcode);

        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        TryFinally([&]()
          {
            InitializeLocation(pHaltState);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchStepHandler: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                pHaltState, pHaltState->IsValid());

            if (pHaltState->IsValid()) // Only proceed if we find a valid top frame and that is the executing function
            {
                if (debugManager->stepController.IsStepComplete(pHaltState, haltCallbackProbe, *pOriginalOpcode))
                {
                    OpCode oldOpcode = *pOriginalOpcode;
                    pHaltState->GetFunction()->ProbeAtOffset(pHaltState->GetCurrentOffset(), pOriginalOpcode);
                    pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                    debugManager->stepController.Deactivate(pHaltState);
                    haltCallbackProbe->DispatchHalt(pHaltState);

                    if (oldOpcode == OpCode::Break && debugManager->stepController.stepType == STEP_DOCUMENT)
                    {
                        // That means we have delivered the stepping to the debugger, where we had the breakpoint
                        // already, however it is possible that debugger can initiate the step_document. In that
                        // case debugger did not break due to break. So we have break as a breakpoint reason.
                        *pOriginalOpcode = OpCode::Break;
                    }
                    else if (OpCode::Break == *pOriginalOpcode)
                    {
                        debugManager->stepController.stepCompleteOnInlineBreakpoint = true;
                    }
                }
            }
          },
          [&](bool)
          {
            DestroyLocation();
          });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchStepHandler: end: pHaltState=%p\n"), pHaltState);
    }